

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrCore.c
# Opt level: O3

int Pdr_ManCheckContainment(Pdr_Man_t *p,int k,Pdr_Set_t *pSet)

{
  int iVar1;
  void *pvVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  
  iVar1 = p->vSolvers->nSize;
  if (k < iVar1) {
    uVar4 = (ulong)(uint)k;
    do {
      if ((k < 0) || (p->vClauses->nSize <= (int)uVar4)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecVec.h"
                      ,0x111,"Vec_Ptr_t *Vec_VecEntry(Vec_Vec_t *, int)");
      }
      pvVar2 = p->vClauses->pArray[uVar4];
      if (0 < *(int *)((long)pvVar2 + 4)) {
        lVar5 = 0;
        do {
          iVar3 = Pdr_SetContains(pSet,*(Pdr_Set_t **)(*(long *)((long)pvVar2 + 8) + lVar5 * 8));
          if (iVar3 != 0) {
            return 1;
          }
          lVar5 = lVar5 + 1;
        } while (lVar5 < *(int *)((long)pvVar2 + 4));
      }
      uVar4 = uVar4 + 1;
    } while ((int)uVar4 < iVar1);
  }
  return 0;
}

Assistant:

int Pdr_ManCheckContainment( Pdr_Man_t * p, int k, Pdr_Set_t * pSet )
{
    Pdr_Set_t * pThis;
    Vec_Ptr_t * vArrayK;
    int i, j, kMax = Vec_PtrSize(p->vSolvers)-1;
    Vec_VecForEachLevelStartStop( p->vClauses, vArrayK, i, k, kMax+1 )
        Vec_PtrForEachEntry( Pdr_Set_t *, vArrayK, pThis, j )
            if ( Pdr_SetContains( pSet, pThis ) )
                return 1;
    return 0;
}